

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall
glu::TextureCube::TextureCube
          (TextureCube *this,RenderContext *context,deUint32 internalFormat,int size)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TextureFormat local_28;
  
  this->m_context = context;
  this->m_isCompressed = false;
  this->m_format = internalFormat;
  local_28 = mapGLInternalFormat(internalFormat);
  tcu::TextureCube::TextureCube(&this->m_refTexture,&local_28,size);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x173);
  return;
}

Assistant:

TextureCube::TextureCube (const RenderContext& context, deUint32 internalFormat, int size)
	: m_context			(context)
	, m_isCompressed	(false)
	, m_format			(internalFormat)
	, m_refTexture		(mapGLInternalFormat(internalFormat), size)
	, m_glTexture		(0)
{
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}